

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kf_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_46c44b::KeyFrameIntervalTestLarge_KeyFrameIntervalTest_Test::TestBody
          (KeyFrameIntervalTestLarge_KeyFrameIntervalTest_Test *this)

{
  undefined1 uVar1;
  bool bVar2;
  Type type;
  int iVar3;
  char *pcVar4;
  Message *pMVar5;
  HasNewFatalFailureHelper *in_RDI;
  AssertionResult gtest_ar;
  HasNewFatalFailureHelper gtest_fatal_failure_checker;
  I420VideoSource video;
  undefined4 uVar6;
  undefined4 in_stack_fffffffffffffebc;
  undefined4 uVar7;
  undefined4 in_stack_fffffffffffffec4;
  bool *in_stack_fffffffffffffec8;
  char *in_stack_fffffffffffffed0;
  char *in_stack_fffffffffffffed8;
  uint in_stack_fffffffffffffee0;
  undefined1 in_stack_fffffffffffffee4;
  undefined1 in_stack_fffffffffffffee5;
  undefined1 in_stack_fffffffffffffee6;
  undefined1 in_stack_fffffffffffffee7;
  allocator *paVar8;
  int in_stack_ffffffffffffff08;
  AssertionResult local_e0;
  Message *in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff40;
  uint in_stack_ffffffffffffff44;
  uint uVar9;
  HasNewFatalFailureHelper local_b8;
  allocator local_89;
  string local_88 [32];
  undefined1 local_68 [104];
  
  pcVar4 = TestFileName();
  paVar8 = &local_89;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_88,pcVar4,paVar8);
  uVar9 = (uint)paVar8;
  type = TestFileWidth();
  iVar3 = TestFileHeight();
  uVar7 = 0x4b;
  uVar6 = 0;
  libaom_test::I420VideoSource::I420VideoSource
            ((I420VideoSource *)in_RDI,(string *)CONCAT44(type,iVar3),
             CONCAT13(in_stack_fffffffffffffee7,
                      CONCAT12(in_stack_fffffffffffffee6,
                               CONCAT11(in_stack_fffffffffffffee5,in_stack_fffffffffffffee4))),
             in_stack_fffffffffffffee0,(int)((ulong)in_stack_fffffffffffffed8 >> 0x20),
             (int)in_stack_fffffffffffffed8,uVar9,in_stack_ffffffffffffff08);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  uVar1 = testing::internal::AlwaysTrue();
  if ((bool)uVar1) {
    testing::internal::HasNewFatalFailureHelper::HasNewFatalFailureHelper(in_RDI);
    in_stack_fffffffffffffee6 = testing::internal::AlwaysTrue();
    if ((bool)in_stack_fffffffffffffee6) {
      (*in_RDI[1].super_TestPartResultReporterInterface._vptr_TestPartResultReporterInterface[2])
                (in_RDI + 1,local_68);
    }
    in_stack_fffffffffffffee5 =
         testing::internal::HasNewFatalFailureHelper::has_new_fatal_failure(&local_b8);
    if ((bool)in_stack_fffffffffffffee5) {
      in_stack_fffffffffffffee0 = 2;
    }
    else {
      in_stack_fffffffffffffee0 = 0;
    }
    testing::internal::HasNewFatalFailureHelper::~HasNewFatalFailureHelper
              ((HasNewFatalFailureHelper *)CONCAT44(in_stack_fffffffffffffec4,uVar7));
    if (in_stack_fffffffffffffee0 == 0) {
      uVar9 = in_stack_fffffffffffffee0;
      testing::internal::EqHelper::Compare<bool,_bool,_nullptr>
                (in_stack_fffffffffffffed8,in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,
                 (bool *)CONCAT44(in_stack_fffffffffffffec4,uVar7));
      bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_e0);
      if (!bVar2) {
        testing::Message::Message((Message *)in_RDI);
        pMVar5 = testing::Message::operator<<
                           ((Message *)CONCAT44(in_stack_fffffffffffffec4,uVar7),
                            (anon_struct_8_2_39c0d697_for__M_head_impl *)
                            CONCAT44(in_stack_fffffffffffffebc,uVar6));
        iVar3 = (int)((ulong)pMVar5 >> 0x20);
        pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x572edf);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)in_RDI,type,
                   (char *)CONCAT17(uVar1,CONCAT16(in_stack_fffffffffffffee6,
                                                   CONCAT15(in_stack_fffffffffffffee5,
                                                            CONCAT14(in_stack_fffffffffffffee4,
                                                                     in_stack_fffffffffffffee0)))),
                   iVar3,pcVar4);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)CONCAT44(uVar9,in_stack_ffffffffffffff40),
                   in_stack_ffffffffffffff38);
        testing::internal::AssertHelper::~AssertHelper
                  ((AssertHelper *)CONCAT44(in_stack_fffffffffffffec4,uVar7));
        testing::Message::~Message((Message *)0x572f2d);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x572fa8);
      goto LAB_00572fc0;
    }
    in_stack_ffffffffffffff44 = in_stack_fffffffffffffee0;
    if (in_stack_fffffffffffffee0 != 2) goto LAB_00572fc0;
  }
  iVar3 = (int)((ulong)in_stack_fffffffffffffed8 >> 0x20);
  testing::Message::Message((Message *)in_RDI);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)in_RDI,type,
             (char *)CONCAT17(uVar1,CONCAT16(in_stack_fffffffffffffee6,
                                             CONCAT15(in_stack_fffffffffffffee5,
                                                      CONCAT14(in_stack_fffffffffffffee4,
                                                               in_stack_fffffffffffffee0)))),iVar3,
             in_stack_fffffffffffffed0);
  testing::internal::AssertHelper::operator=
            ((AssertHelper *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
             in_stack_ffffffffffffff38);
  testing::internal::AssertHelper::~AssertHelper
            ((AssertHelper *)CONCAT44(in_stack_fffffffffffffec4,uVar7));
  testing::Message::~Message((Message *)0x572e11);
LAB_00572fc0:
  libaom_test::I420VideoSource::~I420VideoSource((I420VideoSource *)0x572fcd);
  return;
}

Assistant:

TEST_P(KeyFrameIntervalTestLarge, KeyFrameIntervalTest) {
  libaom_test::I420VideoSource video(TestFileName(), TestFileWidth(),
                                     TestFileHeight(), cfg_.g_timebase.den,
                                     cfg_.g_timebase.num, 0, 75);
  ASSERT_NO_FATAL_FAILURE(RunLoop(&video));
  ASSERT_EQ(is_kf_interval_violated_, false) << kf_dist_param_;
}